

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.cpp
# Opt level: O2

void testReadBadFiles(string *tempdir)

{
  int iVar1;
  uint uVar2;
  ostream *poVar3;
  char *pcVar4;
  ostream *poVar5;
  undefined8 extraout_RAX;
  char *in_RCX;
  string fn;
  exr_context_t f;
  undefined8 local_78;
  code *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fn,
             "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRCoreTest/../OpenEXRTest/"
             ,(allocator<char> *)&local_78);
  std::__cxx11::string::append((char *)&fn);
  local_28 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_18 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0x68;
  uStack_20 = 0xbf800000fffffffe;
  local_70 = err_cb;
  iVar1 = exr_start_read(&f,fn._M_dataplus._M_p);
  if (iVar1 == 6) {
    uVar2 = exr_test_file_header("somenonexistentexrfile.exr",&local_78);
    poVar5 = (ostream *)(ulong)uVar2;
    if (uVar2 == 5) {
      std::__cxx11::string::~string((string *)&fn);
      return;
    }
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar1);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar5 = std::operator<<(poVar5,pcVar4);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,6);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar4 = (char *)exr_get_default_error_message(6);
    poVar3 = std::operator<<(poVar5,pcVar4);
    std::endl<char,std::char_traits<char>>(poVar3);
    core_test_fail("exr_start_read (&f, fn.c_str (), &cinit)",(char *)0x6f,0x31f192,in_RCX);
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)poVar5);
  poVar3 = std::operator<<(poVar3,") ");
  pcVar4 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
  poVar5 = std::operator<<(poVar3,pcVar4);
  poVar5 = std::operator<<(poVar5,"\n    expected: (");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,5);
  poVar5 = std::operator<<(poVar5,") ");
  pcVar4 = (char *)exr_get_default_error_message(5);
  poVar5 = std::operator<<(poVar5,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar5);
  core_test_fail("exr_test_file_header (\"somenonexistentexrfile.exr\", &cinit)",(char *)0x73,
                 0x31f192,in_RCX);
  std::__cxx11::string::~string((string *)&fn);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void
testReadBadFiles (const std::string& tempdir)
{
    exr_context_t f;
    std::string   fn = ILM_IMF_TEST_IMAGEDIR;
    fn += "invalid.exr";
    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    cinit.error_handler_fn          = &err_cb;

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_FILE_BAD_HEADER, exr_start_read (&f, fn.c_str (), &cinit));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_FILE_ACCESS,
        exr_test_file_header ("somenonexistentexrfile.exr", &cinit));
}